

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemm.c
# Opt level: O0

void gemm_nt(int M,int N,int K,float ALPHA,float *A,int lda,float *B,int ldb,float *C,int ldc)

{
  int iVar1;
  float local_40;
  int local_3c;
  float sum;
  int k;
  int j;
  int i;
  float *B_local;
  int lda_local;
  float *A_local;
  float ALPHA_local;
  int K_local;
  int N_local;
  int M_local;
  
  for (k = 0; k < M; k = k + 1) {
    for (sum = 0.0; (int)sum < N; sum = (float)((int)sum + 1)) {
      local_40 = 0.0;
      for (local_3c = 0; local_3c < K; local_3c = local_3c + 1) {
        local_40 = ALPHA * A[k * lda + local_3c] * B[(int)sum * ldb + local_3c] + local_40;
      }
      iVar1 = k * ldc + (int)sum;
      C[iVar1] = local_40 + C[iVar1];
    }
  }
  return;
}

Assistant:

static void gemm_nt(int M, int N, int K, float ALPHA,
                    float *A, int lda,
                    float *B, int ldb,
                    float *C, int ldc)
{
    int i;
    #pragma omp parallel for
    for (i = 0; i < M; ++i)
    {
        int j, k;
        for (j = 0; j < N; ++j)
        {
            float sum = 0;
            for (k = 0; k < K; ++k)
            {
                sum += ALPHA * A[i * lda + k] * B[j * ldb + k];
            }
            C[i * ldc + j] += sum;
        }
    }
}